

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O1

TestSuite * __thiscall doctest::detail::TestSuite::operator*(TestSuite *this,char *in)

{
  this->m_test_suite = in;
  this->m_expected_failures = 0;
  this->m_timeout = 0.0;
  this->m_description = (char *)0x0;
  *(undefined8 *)((long)&this->m_description + 5) = 0;
  return this;
}

Assistant:

TestSuite& TestSuite::operator*(const char* in) {
        m_test_suite = in;
        // clear state
        m_description       = nullptr;
        m_skip              = false;
        m_no_breaks         = false;
        m_no_output         = false;
        m_may_fail          = false;
        m_should_fail       = false;
        m_expected_failures = 0;
        m_timeout           = 0;
        return *this;
    }